

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Code_domain_impl::string_ref::string_ref(string_ref *this,char *str)

{
  pointer pcVar1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  size_t len;
  undefined1 local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  size_t local_28;
  char *local_20;
  
  (this->super_string_ref)._state[2] = (void *)0x0;
  (this->super_string_ref)._state[0] = (void *)0x0;
  (this->super_string_ref)._state[1] = (void *)0x0;
  (this->super_string_ref)._begin = (pointer)0x0;
  (this->super_string_ref)._end = (pointer)0x0;
  (this->super_string_ref)._thunk = _custom_string_thunk;
  local_20 = str;
  local_28 = strlen(str);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const*&,unsigned_long&>
            (&local_30,&local_38,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_39,&local_20,&local_28);
  (this->super_string_ref)._state[0] = local_38;
  (this->super_string_ref)._state[1] = local_30._M_pi;
  if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar1 = (local_38->_M_dataplus)._M_p;
    (this->super_string_ref)._begin = pcVar1;
    (this->super_string_ref)._end = pcVar1 + local_38->_M_string_length;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
      pcVar1 = (local_38->_M_dataplus)._M_p;
      (this->super_string_ref)._begin = pcVar1;
      (this->super_string_ref)._end = pcVar1 + local_38->_M_string_length;
      if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      pcVar1 = (local_38->_M_dataplus)._M_p;
      (this->super_string_ref)._begin = pcVar1;
      (this->super_string_ref)._end = pcVar1 + local_38->_M_string_length;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

explicit string_ref(const char *str)
        : _base::string_ref(_custom_string_thunk)
    {
      static_assert(sizeof(shared_ptr_type) <= sizeof(this->_state), "A shared_ptr does not fit into status_code's state");
      auto len = strlen(str);
      auto p = std::make_shared<std::string>(str, len);
      new(reinterpret_cast<shared_ptr_type *>(this->_state)) shared_ptr_type(p);  // NOLINT
      this->_begin = p->data();
      this->_end = p->data() + p->size();                                         // NOLINT
    }